

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libskiwi.cpp
# Opt level: O2

fptr skiwi::anon_unknown_1::compile(uint64_t *size,string *input,environment_map *env,repl_data *rd)

{
  fptr p_Var1;
  vector<skiwi::token,_std::allocator<skiwi::token>_> tokens;
  shared_ptr<skiwi::environment<skiwi::environment_entry>_> env_copy;
  logic_error e;
  _Rb_tree_node_base local_150;
  _Base_ptr local_130;
  _Rb_tree_node_base local_120;
  size_t local_100;
  asmcode code;
  repl_data rd_copy;
  Program prog;
  
  assembler::asmcode::asmcode(&code);
  prog.quotes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &prog.quotes._M_t._M_impl.super__Rb_tree_header._M_header;
  prog.expressions.
  super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  prog.expressions.
  super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  prog.expressions.
  super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  prog.quotes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  prog.quotes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  prog.quotes._M_t._M_impl.super__Rb_tree_header._M_node_count._0_6_ = 0;
  prog.quotes._M_t._M_impl.super__Rb_tree_header._M_node_count._6_2_ = 0;
  prog.alpha_converted = false;
  prog.assignable_variables_converted = false;
  prog.define_converted = false;
  prog.closure_converted = false;
  prog.cps_converted = false;
  prog.free_variables_analysed = false;
  prog.linear_scan_indices_computed = false;
  prog.lambda_to_let_converted = false;
  prog.include_handled = false;
  prog.simplified_to_core_forms = false;
  prog.single_begin_conversion = false;
  prog.tail_call_analysis = false;
  prog.global_define_env_allocated = false;
  prog.quotes_collected = false;
  prog.quotes_converted = false;
  prog.quasiquotes_converted = false;
  prog.inline_primitives_converted = false;
  prog.constant_folded = false;
  prog.constant_propagated = false;
  prog.macros_expanded = false;
  prog.single_begins_removed = false;
  prog.quotes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       prog.quotes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  make_deep_copy<skiwi::environment_entry>
            ((skiwi *)&env_copy,
             (shared_ptr<skiwi::environment<skiwi::environment_entry>_> *)&DAT_002b3910);
  make_deep_copy(&rd_copy,(repl_data *)&DAT_002b3878);
  tokenize(&tokens,input);
  std::
  __reverse<__gnu_cxx::__normal_iterator<skiwi::token*,std::vector<skiwi::token,std::allocator<skiwi::token>>>>
            (tokens.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
             super__Vector_impl_data._M_start,
             tokens.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
             super__Vector_impl_data._M_finish);
  make_program((Program *)&e,&tokens);
  Program::operator=(&prog,(Program *)&e);
  Program::~Program((Program *)&e);
  std::vector<skiwi::token,_std::allocator<skiwi::token>_>::~vector(&tokens);
  skiwi::compile((environment_map *)&DAT_002b3910,(repl_data *)&DAT_002b3878,
                 (macro_data *)&DAT_002b38c8,(context *)&DAT_002b3720,&code,&prog,
                 (primitive_map *)&DAT_002b3938,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::external_function,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::external_function>_>_>
                  *)&DAT_002b3968,(compiler_options *)&DAT_002b36f4);
  local_150._M_left = &local_150;
  local_150._M_color = _S_red;
  local_150._M_parent = (_Base_ptr)0x0;
  _e = (pointer)0x0;
  local_130 = (_Base_ptr)0x0;
  local_120._M_left = &local_120;
  local_120._M_color = _S_red;
  local_120._M_parent = (_Base_ptr)0x0;
  local_100 = 0;
  local_150._M_right = local_150._M_left;
  local_120._M_right = local_120._M_left;
  p_Var1 = (fptr)assembler::assemble(size,(first_pass_data *)&e,&code);
  assembler::first_pass_data::~first_pass_data((first_pass_data *)&e);
  repl_data::~repl_data(&rd_copy);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&env_copy.
              super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  Program::~Program(&prog);
  assembler::asmcode::~asmcode(&code);
  return p_Var1;
}

Assistant:

compiler_data::fptr compile(uint64_t& size, const std::string& input, environment_map& env, repl_data& rd)
    {
    using namespace SKIWI;

    asmcode code;
    Program prog;
    auto env_copy = make_deep_copy(env);
    auto rd_copy = make_deep_copy(rd);
    try
      {
      auto tokens = tokenize(input);
      std::reverse(tokens.begin(), tokens.end());
      prog = make_program(tokens);
      }
    catch (std::logic_error e)
      {
      env = env_copy;
      rd = rd_copy;
      code.clear();
      err(e.what(), "\n");
      return nullptr;
      }
    try
      {
      compile(env, rd, cd.md, cd.ctxt, code, prog, cd.pm, cd.externals, cd.ops);
      first_pass_data d;
      compiler_data::fptr f = (compiler_data::fptr)assemble(size, d, code);
      return f;
      }
    catch (std::logic_error e)
      {
      env = env_copy;
      rd = rd_copy;
      code.clear();
      err(e.what(), "\n");
      }
    catch (std::runtime_error e)
      {
      env = env_copy;
      rd = rd_copy;
      code.clear();
      err(e.what(), "\n");
      }
    return nullptr;
    }